

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyObj.c
# Opt level: O0

void Ivy_ObjDisconnect(Ivy_Man_t *p,Ivy_Obj_t *pObj)

{
  int iVar1;
  Ivy_Obj_t *pIVar2;
  Ivy_Obj_t *pObj_local;
  Ivy_Man_t *p_local;
  
  iVar1 = Ivy_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyObj.c"
                  ,0xbb,"void Ivy_ObjDisconnect(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  iVar1 = Ivy_ObjIsPi(pObj);
  if (((iVar1 == 0) && (iVar1 = Ivy_ObjIsOneFanin(pObj), iVar1 == 0)) &&
     (pIVar2 = Ivy_ObjFanin1(pObj), pIVar2 == (Ivy_Obj_t *)0x0)) {
    __assert_fail("Ivy_ObjIsPi(pObj) || Ivy_ObjIsOneFanin(pObj) || Ivy_ObjFanin1(pObj) != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyObj.c"
                  ,0xbc,"void Ivy_ObjDisconnect(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  if (pObj->pFanin0 != (Ivy_Obj_t *)0x0) {
    pIVar2 = Ivy_ObjFanin0(pObj);
    Ivy_ObjRefsDec(pIVar2);
    if (p->fFanout != 0) {
      pIVar2 = Ivy_ObjFanin0(pObj);
      Ivy_ObjDeleteFanout(p,pIVar2,pObj);
    }
  }
  if (pObj->pFanin1 != (Ivy_Obj_t *)0x0) {
    pIVar2 = Ivy_ObjFanin1(pObj);
    Ivy_ObjRefsDec(pIVar2);
    if (p->fFanout != 0) {
      pIVar2 = Ivy_ObjFanin1(pObj);
      Ivy_ObjDeleteFanout(p,pIVar2,pObj);
    }
  }
  if (pObj->pNextFan0 != (Ivy_Obj_t *)0x0) {
    __assert_fail("pObj->pNextFan0 == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyObj.c"
                  ,0xca,"void Ivy_ObjDisconnect(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  if (pObj->pNextFan1 != (Ivy_Obj_t *)0x0) {
    __assert_fail("pObj->pNextFan1 == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyObj.c"
                  ,0xcb,"void Ivy_ObjDisconnect(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  if (pObj->pPrevFan0 != (Ivy_Obj_t *)0x0) {
    __assert_fail("pObj->pPrevFan0 == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyObj.c"
                  ,0xcc,"void Ivy_ObjDisconnect(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  if (pObj->pPrevFan1 != (Ivy_Obj_t *)0x0) {
    __assert_fail("pObj->pPrevFan1 == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyObj.c"
                  ,0xcd,"void Ivy_ObjDisconnect(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  Ivy_TableDelete(p,pObj);
  pObj->pFanin0 = (Ivy_Obj_t *)0x0;
  pObj->pFanin1 = (Ivy_Obj_t *)0x0;
  return;
}

Assistant:

void Ivy_ObjDisconnect( Ivy_Man_t * p, Ivy_Obj_t * pObj )
{
    assert( !Ivy_IsComplement(pObj) );
    assert( Ivy_ObjIsPi(pObj) || Ivy_ObjIsOneFanin(pObj) || Ivy_ObjFanin1(pObj) != NULL );
    // remove connections
    if ( pObj->pFanin0 != NULL )
    {
        Ivy_ObjRefsDec(Ivy_ObjFanin0(pObj));
        if ( p->fFanout )
            Ivy_ObjDeleteFanout( p, Ivy_ObjFanin0(pObj), pObj );
    }
    if ( pObj->pFanin1 != NULL )
    {
        Ivy_ObjRefsDec(Ivy_ObjFanin1(pObj));
        if ( p->fFanout )
            Ivy_ObjDeleteFanout( p, Ivy_ObjFanin1(pObj), pObj );
    }
    assert( pObj->pNextFan0 == NULL );
    assert( pObj->pNextFan1 == NULL );
    assert( pObj->pPrevFan0 == NULL );
    assert( pObj->pPrevFan1 == NULL );
    // remove the node from the structural hash table
    Ivy_TableDelete( p, pObj );
    // add the first fanin
    pObj->pFanin0 = NULL;
    pObj->pFanin1 = NULL;
}